

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

void __thiscall Samba::writeBinary(Samba *this,uint8_t *buffer,int size)

{
  int iVar1;
  pointer pSVar2;
  SambaError *this_00;
  uint local_1c;
  int written;
  int size_local;
  uint8_t *buffer_local;
  Samba *this_local;
  
  local_1c = size;
  _written = buffer;
  while( true ) {
    if (local_1c == 0) {
      return;
    }
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    iVar1 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,_written,(ulong)local_1c);
    if (iVar1 < 1) break;
    _written = _written + iVar1;
    local_1c = local_1c - iVar1;
  }
  this_00 = (SambaError *)__cxa_allocate_exception(8);
  SambaError::SambaError(this_00);
  __cxa_throw(this_00,&SambaError::typeinfo,SambaError::~SambaError);
}

Assistant:

void
Samba::writeBinary(const uint8_t* buffer, int size)
{
    while (size)
    {
        int written = _port->write(buffer, size);
        if (written <= 0)
            throw SambaError();
        buffer += written;
        size -= written;
    }
}